

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::AddSymbol
          (DescriptorIndex *this,string_view symbol)

{
  byte bVar1;
  pointer pSVar2;
  _Alloc_hider _Var3;
  DescriptorIndex *pDVar4;
  undefined8 uVar5;
  bool bVar6;
  reference pSVar7;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  _Var8;
  LogMessage *pLVar9;
  size_t sVar10;
  char *pcVar11;
  size_t sVar12;
  btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>
  *this_00;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  this_01;
  SymbolEntry *this_02;
  bool bVar13;
  const_iterator cVar14;
  iterator iVar15;
  const_iterator other;
  string_view str;
  string_view str_00;
  string_view v;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view v_00;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view v_01;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view v_02;
  string_view str_10;
  string_view str_11;
  string_view super_symbol;
  string_view super_symbol_00;
  string_view super_symbol_01;
  string_view super_symbol_02;
  string_view sub_symbol;
  string_view sub_symbol_00;
  string_view sub_symbol_01;
  string_view sub_symbol_02;
  string entry_as_string;
  SymbolEntry entry;
  string local_128;
  DescriptorIndex *local_108;
  DescriptorIndex *local_100;
  btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
  local_f8;
  string local_e8;
  btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>
  *local_c8;
  undefined1 local_c0 [32];
  LogMessage local_a0;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string local_68;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>,_bool>
  local_48;
  
  pcVar11 = symbol._M_str;
  sVar12 = symbol._M_len;
  local_90._0_4_ =
       (int)((ulong)((long)(this->all_values_).
                           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->all_values_).
                          super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 + -1;
  local_88._M_p = (pointer)&local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,pcVar11,pcVar11 + sVar12);
  SymbolEntry::AsString_abi_cxx11_((string *)local_c0,(SymbolEntry *)local_90,this);
  bVar13 = sVar12 == 0;
  if (!bVar13) {
    sVar10 = 0;
    do {
      bVar1 = pcVar11[sVar10];
      if ((((bVar1 != 0x2e) && (bVar1 != 0x5f)) && ((byte)(bVar1 - 0x3a) < 0xf6)) &&
         ((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6)) break;
      sVar10 = sVar10 + 1;
      bVar13 = sVar12 == sVar10;
    } while (!bVar13);
  }
  if (bVar13) {
    this_00 = (btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>
               *)&this->by_symbol_;
    cVar14 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
             ::
             upper_bound<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>
                       ((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                         *)this_00,(SymbolEntry *)local_90);
    local_128._M_dataplus._M_p = (pointer)cVar14.node_;
    local_128._M_string_length._0_4_ = cVar14.position_;
    cVar14 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
             ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                      *)this_00);
    bVar13 = absl::lts_20250127::container_internal::
             btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
             ::Equals((btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
                       *)&local_128,cVar14);
    if (!bVar13) {
      absl::lts_20250127::container_internal::
      btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
      ::decrement((btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
                   *)&local_128);
    }
    uVar5 = local_c0._0_8_;
    local_f8.node_ =
         (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
          *)local_128._M_dataplus._M_p;
    local_f8.position_ = (int)local_128._M_string_length;
    local_108 = (DescriptorIndex *)local_c0._8_8_;
    iVar15 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
             ::end((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                    *)this_00);
    bVar13 = absl::lts_20250127::container_internal::
             btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
             ::Equals(&local_f8,(const_iterator)iVar15);
    local_c8 = this_00;
    if (bVar13) {
LAB_0021df15:
      _Var8 = std::
              __upper_bound<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>>
                        ((this->by_symbol_flat_).
                         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->by_symbol_flat_).
                         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(SymbolEntry *)local_90,
                         (_Val_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
                          )(this->by_symbol_).
                           super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
                           .
                           super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
                           .tree_.rightmost_.
                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>::checked_compare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                           .
                           super_Storage<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>::checked_compare,_0UL,_false>
                           .value.
                           super_checked_compare_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_true>
                           .super_SymbolCompare.index);
      uVar5 = local_c0._0_8_;
      this_01._M_current = _Var8._M_current + -1;
      if (_Var8._M_current ==
          (this->by_symbol_flat_).
          super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        this_01 = _Var8;
      }
      pSVar2 = (this->by_symbol_flat_).
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar13 = true;
      if (this_01._M_current != pSVar2) {
        SymbolEntry::AsString_abi_cxx11_(&local_128,this_01._M_current,this);
        _Var3._M_p = local_128._M_dataplus._M_p;
        sub_symbol_01._M_len._4_4_ = local_128._M_string_length._4_4_;
        sub_symbol_01._M_len._0_4_ = (int)local_128._M_string_length;
        local_100 = (DescriptorIndex *)local_c0._8_8_;
        super_symbol_01._M_str = (char *)uVar5;
        super_symbol_01._M_len = local_c0._8_8_;
        sub_symbol_01._M_str = local_128._M_dataplus._M_p;
        local_108 = this;
        bVar13 = anon_unknown_23::IsSubSymbol(sub_symbol_01,super_symbol_01);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var3._M_p != &local_128.field_2) {
          operator_delete(_Var3._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        pDVar4 = local_108;
        if (bVar13) {
          absl::lts_20250127::log_internal::LogMessage::LogMessage
                    ((LogMessage *)&local_e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
                     ,0x2c1);
          this_00 = local_c8;
          pDVar4 = local_108;
          str_00._M_str = "Symbol name \"";
          str_00._M_len = 0xd;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    ((LogMessage *)&local_e8,str_00);
          v._M_str = (char *)uVar5;
          v._M_len = (size_t)local_100;
          pLVar9 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             ((LogMessage *)&local_e8,v);
          str_01._M_str = "\" conflicts with the existing symbol \"";
          str_01._M_len = 0x26;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (pLVar9,str_01);
          SymbolEntry::AsString_abi_cxx11_(&local_128,this_01._M_current,pDVar4);
          pLVar9 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar9,&local_128);
          str_02._M_str = "\".";
          str_02._M_len = 2;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (pLVar9,str_02);
          AddSymbol();
        }
        else {
          this_02 = this_01._M_current + 1;
          if (this_02 == pSVar2) {
            bVar6 = false;
          }
          else {
            SymbolEntry::AsString_abi_cxx11_(&local_128,this_02,local_108);
            super_symbol_02._M_len._4_4_ = local_128._M_string_length._4_4_;
            super_symbol_02._M_len._0_4_ = (int)local_128._M_string_length;
            super_symbol_02._M_str = local_128._M_dataplus._M_p;
            sub_symbol_02._M_str = (char *)uVar5;
            sub_symbol_02._M_len = (size_t)local_100;
            bVar6 = anon_unknown_23::IsSubSymbol(sub_symbol_02,super_symbol_02);
          }
          bVar13 = true;
          if ((this_02 != pSVar2) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2)) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          this_00 = local_c8;
          if (bVar6 == false) goto LAB_0021e01c;
          absl::lts_20250127::log_internal::LogMessage::LogMessage
                    (&local_a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
                     ,0x2cf);
          str_03._M_str = "Symbol name \"";
          str_03._M_len = 0xd;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (&local_a0,str_03);
          v_00._M_str = (char *)uVar5;
          v_00._M_len = (size_t)local_100;
          pLVar9 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_a0,v_00);
          str_04._M_str = "\" conflicts with the existing symbol \"";
          str_04._M_len = 0x26;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (pLVar9,str_04);
          SymbolEntry::AsString_abi_cxx11_(&local_e8,this_02,pDVar4);
          pLVar9 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar9,&local_e8);
          str_05._M_str = "\".";
          str_05._M_len = 2;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (pLVar9,str_05);
          AddSymbol();
        }
        bVar13 = false;
      }
LAB_0021e01c:
      if (bVar13) {
        iVar15.position_ = local_f8.position_;
        iVar15.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                        *)local_f8.node_;
        iVar15._12_4_ = 0;
        absl::lts_20250127::container_internal::
        btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>
        ::
        insert_hint_unique<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const&>
                  (&local_48,this_00,iVar15,(SymbolEntry *)local_90,(SymbolEntry *)local_90);
      }
      goto LAB_0021e314;
    }
    pSVar7 = absl::lts_20250127::container_internal::
             btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
             ::operator*(&local_f8);
    SymbolEntry::AsString_abi_cxx11_(&local_128,pSVar7,this);
    _Var3._M_p = local_128._M_dataplus._M_p;
    sub_symbol._M_len._4_4_ = local_128._M_string_length._4_4_;
    sub_symbol._M_len._0_4_ = (int)local_128._M_string_length;
    local_100 = (DescriptorIndex *)uVar5;
    super_symbol._M_str = (char *)uVar5;
    super_symbol._M_len = (size_t)local_108;
    sub_symbol._M_str = local_128._M_dataplus._M_p;
    bVar13 = anon_unknown_23::IsSubSymbol(sub_symbol,super_symbol);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != &local_128.field_2) {
      operator_delete(_Var3._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (bVar13) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                ((LogMessage *)&local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
                 ,0x2c1);
      pDVar4 = local_100;
      str_06._M_str = "Symbol name \"";
      str_06._M_len = 0xd;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)&local_e8,str_06);
      v_01._M_str = (char *)pDVar4;
      v_01._M_len = (size_t)local_108;
      pLVar9 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         ((LogMessage *)&local_e8,v_01);
      str_07._M_str = "\" conflicts with the existing symbol \"";
      str_07._M_len = 0x26;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (pLVar9,str_07);
      pSVar7 = absl::lts_20250127::container_internal::
               btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
               ::operator*(&local_f8);
      SymbolEntry::AsString_abi_cxx11_(&local_128,pSVar7,this);
      pLVar9 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar9,&local_128);
      str_08._M_str = "\".";
      str_08._M_len = 2;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (pLVar9,str_08);
      AddSymbol();
    }
    else {
      absl::lts_20250127::container_internal::
      btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
      ::increment(&local_f8);
      this_00 = local_c8;
      pDVar4 = local_100;
      other._12_4_ = 0;
      other.node_ = (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                     *)SUB128(iVar15._0_12_,0);
      other.position_ = SUB124(iVar15._0_12_,8);
      bVar13 = absl::lts_20250127::container_internal::
               btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
               ::Equals(&local_f8,other);
      if (bVar13) {
        bVar13 = false;
      }
      else {
        pSVar7 = absl::lts_20250127::container_internal::
                 btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
                 ::operator*(&local_f8);
        SymbolEntry::AsString_abi_cxx11_(&local_68,pSVar7,this);
        super_symbol_00._M_str = local_68._M_dataplus._M_p;
        super_symbol_00._M_len = local_68._M_string_length;
        sub_symbol_00._M_str = (char *)pDVar4;
        sub_symbol_00._M_len = (size_t)local_108;
        bVar13 = anon_unknown_23::IsSubSymbol(sub_symbol_00,super_symbol_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar13 == false) goto LAB_0021df15;
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                ((LogMessage *)&local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
                 ,0x2cf);
      str_09._M_str = "Symbol name \"";
      str_09._M_len = 0xd;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)&local_e8,str_09);
      v_02._M_str = (char *)pDVar4;
      v_02._M_len = (size_t)local_108;
      pLVar9 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         ((LogMessage *)&local_e8,v_02);
      str_10._M_str = "\" conflicts with the existing symbol \"";
      str_10._M_len = 0x26;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (pLVar9,str_10);
      pSVar7 = absl::lts_20250127::container_internal::
               btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
               ::operator*(&local_f8);
      SymbolEntry::AsString_abi_cxx11_(&local_128,pSVar7,this);
      pLVar9 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar9,&local_128);
      str_11._M_str = "\".";
      str_11._M_len = 2;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (pLVar9,str_11);
      AddSymbol();
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              ((LogMessage *)&local_128,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x2e4);
    str._M_str = "Invalid symbol name: ";
    str._M_len = 0x15;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)&local_128,str);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_128,(string *)local_c0);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&local_128);
  }
  bVar13 = false;
LAB_0021e314:
  if ((DescriptorIndex *)local_c0._0_8_ != (DescriptorIndex *)(local_c0 + 0x10)) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_p != &local_78) {
    operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
  }
  return bVar13;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddSymbol(
    absl::string_view symbol) {
  SymbolEntry entry = {static_cast<int>(all_values_.size() - 1),
                       EncodeString(symbol)};
  std::string entry_as_string = entry.AsString(*this);

  // We need to make sure not to violate our map invariant.

  // If the symbol name is invalid it could break our lookup algorithm (which
  // relies on the fact that '.' sorts before all other characters that are
  // valid in symbol names).
  if (!ValidateSymbolName(symbol)) {
    ABSL_LOG(ERROR) << "Invalid symbol name: " << entry_as_string;
    return false;
  }

  auto iter = FindLastLessOrEqual(&by_symbol_, entry);
  if (!CheckForMutualSubsymbols(entry_as_string, &iter, by_symbol_.end(),
                                *this)) {
    return false;
  }

  // Same, but on by_symbol_flat_
  auto flat_iter =
      FindLastLessOrEqual(&by_symbol_flat_, entry, by_symbol_.key_comp());
  if (!CheckForMutualSubsymbols(entry_as_string, &flat_iter,
                                by_symbol_flat_.end(), *this)) {
    return false;
  }

  // OK, no conflicts.

  // Insert the new symbol using the iterator as a hint, the new entry will
  // appear immediately before the one the iterator is pointing at.
  by_symbol_.insert(iter, entry);

  return true;
}